

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Expr * exprTableRegister(Parse *pParse,Table *pTab,int regBase,i16 iCol)

{
  sqlite3 *db;
  Column *pCVar1;
  i16 iVar2;
  Expr *pExpr;
  char *zC;
  Expr *pEVar3;
  
  db = pParse->db;
  pExpr = sqlite3Expr(db,0xb0,(char *)0x0);
  pEVar3 = (Expr *)0x0;
  if (pExpr != (Expr *)0x0) {
    if ((-1 < iCol) && (pTab->iPKey != iCol)) {
      pCVar1 = pTab->aCol;
      iVar2 = sqlite3TableColumnToStorage(pTab,iCol);
      pExpr->iTable = iVar2 + regBase + 1;
      pExpr->affExpr = pCVar1[(ushort)iCol].affinity;
      zC = sqlite3ColumnColl(pCVar1 + (ushort)iCol);
      if (zC == (char *)0x0) {
        zC = db->pDfltColl->zName;
      }
      pEVar3 = sqlite3ExprAddCollateString(pParse,pExpr,zC);
      return pEVar3;
    }
    pExpr->iTable = regBase;
    pExpr->affExpr = 'D';
    pEVar3 = pExpr;
  }
  return pEVar3;
}

Assistant:

static Expr *exprTableRegister(
  Parse *pParse,     /* Parsing and code generating context */
  Table *pTab,       /* The table whose content is at r[regBase]... */
  int regBase,       /* Contents of table pTab */
  i16 iCol           /* Which column of pTab is desired */
){
  Expr *pExpr;
  Column *pCol;
  const char *zColl;
  sqlite3 *db = pParse->db;

  pExpr = sqlite3Expr(db, TK_REGISTER, 0);
  if( pExpr ){
    if( iCol>=0 && iCol!=pTab->iPKey ){
      pCol = &pTab->aCol[iCol];
      pExpr->iTable = regBase + sqlite3TableColumnToStorage(pTab,iCol) + 1;
      pExpr->affExpr = pCol->affinity;
      zColl = sqlite3ColumnColl(pCol);
      if( zColl==0 ) zColl = db->pDfltColl->zName;
      pExpr = sqlite3ExprAddCollateString(pParse, pExpr, zColl);
    }else{
      pExpr->iTable = regBase;
      pExpr->affExpr = SQLITE_AFF_INTEGER;
    }
  }
  return pExpr;
}